

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::ReadCSV
          (Connection *this,string *csv_file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *columns)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  bool bVar2;
  idx_t iVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  string *this_00;
  shared_ptr<duckdb::Relation,_true> sVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  ColumnDefinition *col_def;
  ColumnList col_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range1;
  child_list_t<Value> column_list;
  named_parameter_map_t options;
  ColumnDefinition *in_stack_fffffffffffffcd8;
  ColumnList *in_stack_fffffffffffffce0;
  iterator in_stack_fffffffffffffce8;
  ClientContext *in_stack_fffffffffffffcf0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *in_stack_fffffffffffffd08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  string *psVar6;
  ColumnList *in_stack_fffffffffffffd28;
  LogicalIndex in_stack_fffffffffffffd30;
  string local_260 [32];
  string *local_240;
  undefined8 local_238;
  string local_200 [32];
  string local_1e0 [72];
  string *in_stack_fffffffffffffe68;
  ParserOptions in_stack_fffffffffffffe80;
  LogicalIndex local_160;
  ColumnDefinition *local_158;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [48];
  ColumnDefinition *local_118;
  ColumnList *pCStack_110;
  iterator local_108;
  reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  undefined8 local_78;
  undefined8 local_20;
  string *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)0x880e37);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x880e44);
  local_78 = local_20;
  local_80._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcd8);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffcd8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffce0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (!bVar2) {
      ::std::__cxx11::string::string(local_260,local_18);
      local_240 = local_260;
      local_238 = 1;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x881244);
      iVar1._M_len = (size_type)in_stack_fffffffffffffcf0;
      iVar1._M_array = in_stack_fffffffffffffce8;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_fffffffffffffce0,iVar1,(allocator_type *)in_stack_fffffffffffffcd8);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x881275);
      psVar6 = local_260;
      this_00 = (string *)&local_240;
      do {
        this_00 = this_00 + -0x20;
        ::std::__cxx11::string::~string(this_00);
      } while (this_00 != psVar6);
      make_shared_ptr<duckdb::ReadCSVRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::vector<std::__cxx11::string,true>&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
                ((shared_ptr<duckdb::ClientContext,_true> *)this_00,in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08);
      shared_ptr<duckdb::Relation,_true>::shared_ptr<duckdb::ReadCSVRelation,_0>
                ((shared_ptr<duckdb::Relation,_true> *)in_stack_fffffffffffffce0,
                 (shared_ptr<duckdb::ReadCSVRelation,_true> *)in_stack_fffffffffffffcd8);
      shared_ptr<duckdb::ReadCSVRelation,_true>::~shared_ptr
                ((shared_ptr<duckdb::ReadCSVRelation,_true> *)0x8812fb);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x881308);
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                 *)0x881315);
      ::std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                        *)0x881322);
      sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (shared_ptr<duckdb::Relation,_true>)
             sVar5.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_90 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_80);
    shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffce0);
    ClientContext::GetParserOptions(in_stack_fffffffffffffcf0);
    in_stack_fffffffffffffcd8 = local_118;
    in_stack_fffffffffffffce0 = pCStack_110;
    in_stack_fffffffffffffce8 = local_108;
    Parser::ParseColumnList(in_stack_fffffffffffffe68,in_stack_fffffffffffffe80);
    iVar3 = ColumnList::LogicalColumnCount((ColumnList *)0x880f2d);
    if (iVar3 != 1) break;
    LogicalIndex::LogicalIndex(&local_160,0);
    local_158 = ColumnList::GetColumnMutable(in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
    ColumnDefinition::GetName_abi_cxx11_(in_stack_fffffffffffffcd8);
    ColumnDefinition::GetType(in_stack_fffffffffffffcd8);
    LogicalType::ToString_abi_cxx11_((LogicalType *)options._M_h._M_element_count);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)in_stack_fffffffffffffd30.index,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)in_stack_fffffffffffffce0,(value_type *)in_stack_fffffffffffffcd8);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)in_stack_fffffffffffffce0);
    ::std::__cxx11::string::~string(local_200);
    LogicalType::~LogicalType((LogicalType *)0x88112f);
    ::std::__cxx11::string::~string(local_1e0);
    ColumnList::~ColumnList(in_stack_fffffffffffffce0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_80);
  }
  local_14a = 1;
  uVar4 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_148,"Expected a single column definition",&local_149);
  ParserException::ParserException
            ((ParserException *)in_stack_fffffffffffffce0,&in_stack_fffffffffffffcd8->name);
  local_14a = 0;
  __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

shared_ptr<Relation> Connection::ReadCSV(const string &csv_file, const vector<string> &columns) {
	// parse columns
	named_parameter_map_t options;
	child_list_t<Value> column_list;
	for (auto &column : columns) {
		auto col_list = Parser::ParseColumnList(column, context->GetParserOptions());
		if (col_list.LogicalColumnCount() != 1) {
			throw ParserException("Expected a single column definition");
		}
		auto &col_def = col_list.GetColumnMutable(LogicalIndex(0));
		column_list.push_back({col_def.GetName(), col_def.GetType().ToString()});
	}
	vector<string> files {csv_file};
	return make_shared_ptr<ReadCSVRelation>(context, files, std::move(options));
}